

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O0

void __thiscall GdlFeatureDefn::SortFeatSettings(GdlFeatureDefn *this)

{
  value_type pGVar1;
  value_type pGVar2;
  int iVar3;
  size_type_conflict sVar4;
  reference ppGVar5;
  long in_RDI;
  GdlFeatureSetting *pfsetTemp;
  int nVal2;
  size_t ifset2;
  int nVal1;
  size_t ifset1;
  ulong local_20;
  int local_14;
  ulong local_10;
  
  sVar4 = std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::size
                    ((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)
                     (in_RDI + 0x70));
  if (1 < sVar4) {
    for (local_10 = 0;
        sVar4 = std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::size
                          ((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)
                           (in_RDI + 0x70)), local_10 < sVar4 - 1; local_10 = local_10 + 1) {
      ppGVar5 = std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::operator[]
                          ((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)
                           (in_RDI + 0x70),local_10);
      local_14 = GdlFeatureSetting::Value(*ppGVar5);
      local_20 = local_10;
      while( true ) {
        local_20 = local_20 + 1;
        sVar4 = std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::size
                          ((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)
                           (in_RDI + 0x70));
        if (sVar4 <= local_20) break;
        ppGVar5 = std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::operator[]
                            ((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)
                             (in_RDI + 0x70),local_20);
        iVar3 = GdlFeatureSetting::Value(*ppGVar5);
        if (iVar3 < local_14) {
          ppGVar5 = std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::
                    operator[]((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)
                               (in_RDI + 0x70),local_10);
          pGVar1 = *ppGVar5;
          ppGVar5 = std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::
                    operator[]((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)
                               (in_RDI + 0x70),local_20);
          pGVar2 = *ppGVar5;
          ppGVar5 = std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::
                    operator[]((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)
                               (in_RDI + 0x70),local_10);
          *ppGVar5 = pGVar2;
          ppGVar5 = std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::
                    operator[]((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)
                               (in_RDI + 0x70),local_20);
          *ppGVar5 = pGVar1;
          ppGVar5 = std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::
                    operator[]((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)
                               (in_RDI + 0x70),local_10);
          local_14 = GdlFeatureSetting::Value(*ppGVar5);
        }
      }
    }
  }
  return;
}

Assistant:

void GdlFeatureDefn::SortFeatSettings()
{
	if (m_vpfset.size() > 1) {
		for (size_t ifset1 = 0; ifset1 < m_vpfset.size() - 1; ifset1++)
		{
			int nVal1 = m_vpfset[ifset1]->Value();
			for (size_t ifset2 = ifset1 + 1; ifset2 < m_vpfset.size(); ifset2++)
			{
				int nVal2 = m_vpfset[ifset2]->Value();
				if (nVal1 > nVal2)
				{
					GdlFeatureSetting * pfsetTemp = m_vpfset[ifset1];
					m_vpfset[ifset1] = m_vpfset[ifset2];
					m_vpfset[ifset2] = pfsetTemp;
					nVal1 = m_vpfset[ifset1]->Value();
				}
			}
		}
	}
}